

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void png_write(char *filename,image_t *image)

{
  char *pcVar1;
  FILE *__stream;
  image_t *piVar2;
  int *piVar3;
  char *pcVar4;
  png_bytepp image_00;
  uint local_48;
  int local_44;
  uint y;
  int bytes_per_pixel;
  int color_type;
  int bit_depth;
  png_bytepp imagep;
  png_infop info_ptr;
  png_structp png_ptr;
  FILE *stream;
  image_t *image_local;
  char *filename_local;
  
  stream = (FILE *)image;
  image_local = (image_t *)filename;
  png_ptr = (png_structp)fopen(filename,"wb");
  piVar2 = image_local;
  __stream = _stderr;
  pcVar1 = argv0;
  if (png_ptr == (png_structp)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"%s: couldn\'t open %s for writing: %s\n",pcVar1,piVar2,pcVar4);
  }
  else {
    if (*(int *)&stream->_IO_read_end == 7) {
      y = 0;
      local_44 = 1;
    }
    else {
      y = 6;
      local_44 = 4;
    }
    info_ptr = (png_infop)
               png_create_write_struct
                         ("1.6.44",(png_voidp)0x0,(png_error_ptr)0x0,(png_error_ptr)0x0);
    png_set_compression_level((png_structrp)info_ptr,1);
    imagep = (png_bytepp)png_create_info_struct((png_const_structrp)info_ptr);
    png_init_io((png_structrp)info_ptr,(png_FILE_p)png_ptr);
    png_set_IHDR((png_const_structrp)info_ptr,(png_inforp)imagep,
                 *(png_uint_32 *)&stream->_IO_read_ptr,
                 *(png_uint_32 *)((long)&stream->_IO_read_ptr + 4),8,y,0,0,0);
    png_write_info((png_structrp)info_ptr,(png_const_inforp)imagep);
    image_00 = (png_bytepp)malloc((ulong)*(uint *)((long)&stream->_IO_read_ptr + 4) << 3);
    for (local_48 = 0; local_48 < *(uint *)((long)&stream->_IO_read_ptr + 4);
        local_48 = local_48 + 1) {
      image_00[local_48] =
           (png_byte *)
           (*(long *)stream + (ulong)(local_48 * *(int *)&stream->_IO_read_ptr * local_44));
    }
    png_write_image((png_structrp)info_ptr,image_00);
    free(image_00);
    png_write_end((png_structrp)info_ptr,(png_inforp)imagep);
    png_destroy_write_struct((png_structpp)&info_ptr,(png_infopp)&imagep);
    fclose((FILE *)png_ptr);
  }
  return;
}

Assistant:

void
png_write(
    const char* filename,
    image_t* image)
{
    FILE* stream;
    png_structp png_ptr;
    png_infop info_ptr;
    png_bytepp imagep;

    int bit_depth;
    int color_type;
    int bytes_per_pixel;

    stream = fopen(filename, "wb");
    if(!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        return;
    }

    if (image->format == FORMAT_GRAY8) {
        bit_depth = 8;
        color_type = PNG_COLOR_TYPE_GRAY;
        bytes_per_pixel = 1;
    } else /* if (image->format == FORMAT_RGBA8888) */ {
        bit_depth = 8;
        color_type = PNG_COLOR_TYPE_RGB_ALPHA;
        bytes_per_pixel = 4;
    } /* else { abort(); } */

    png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    png_set_compression_level(png_ptr, 1);
    info_ptr = png_create_info_struct(png_ptr);
    png_init_io(png_ptr, stream);

    png_set_IHDR(png_ptr, info_ptr,
        image->width, image->height, bit_depth, color_type,
        PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

    png_write_info(png_ptr, info_ptr);

    imagep = malloc(image->height * sizeof(png_byte*));
    for (unsigned int y = 0; y < image->height; ++y)
        imagep[y] = (png_byte*)(image->data + y * image->width * bytes_per_pixel);

    png_write_image(png_ptr, imagep);
    free(imagep);
    png_write_end(png_ptr, info_ptr);
    png_destroy_write_struct(&png_ptr, &info_ptr);

    fclose(stream);
}